

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void xprint_paren(Parser *pp,PNode *p)

{
  uint32 *puVar1;
  PNode *pPVar2;
  int __c;
  ulong uVar3;
  PNode *pn;
  char *pcVar4;
  
  do {
    pn = p->latest;
    while (pPVar2 = pn->latest, pn != pPVar2) {
      pPVar2->refcount = pPVar2->refcount + 1;
      puVar1 = &pn->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(pp,pn);
      }
      p->latest = pPVar2;
      pn = pPVar2;
    }
    if (pn->error_recovery != '\0') {
      return;
    }
    printf("[%p %s]",pn,pp->t->symbols[(pn->parse_node).symbol].name);
    if ((pn->children).n == 0) {
      if ((pn->parse_node).start_loc.s != (pn->parse_node).end_skip) {
        putchar(0x20);
        for (pcVar4 = (pn->parse_node).start_loc.s; pcVar4 < (pn->parse_node).end_skip;
            pcVar4 = pcVar4 + 1) {
          putchar((int)*pcVar4);
        }
        __c = 0x20;
        goto LAB_00141eb1;
      }
    }
    else {
      putchar(0x28);
      for (uVar3 = 0; uVar3 < (pn->children).n; uVar3 = uVar3 + 1) {
        xprint_paren(pp,(pn->children).v[uVar3]);
      }
      __c = 0x29;
LAB_00141eb1:
      putchar(__c);
    }
    if (pn->ambiguities == (PNode *)0x0) {
      return;
    }
    printf(" |OR| ");
    p = pn->ambiguities;
  } while( true );
}

Assistant:

void xprint_paren(Parser *pp, PNode *p) {
  uint i;
  char *c;
  LATEST(pp, p);
  if (!p->error_recovery) {
    printf("[%p %s]", (void *)p, pp->t->symbols[p->parse_node.symbol].name);
    if (p->children.n) {
      printf("(");
      for (i = 0; i < p->children.n; i++) xprint_paren(pp, p->children.v[i]);
      printf(")");
    } else if (p->parse_node.start_loc.s != p->parse_node.end_skip) {
      printf(" ");
      for (c = p->parse_node.start_loc.s; c < p->parse_node.end_skip; c++) printf("%c", *c);
      printf(" ");
    }
    if (p->ambiguities) {
      printf(" |OR| ");
      xprint_paren(pp, p->ambiguities);
    }
  }
}